

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::reshapeTest(ViewTest *this)

{
  float fVar1;
  size_t j;
  long lVar2;
  runtime_error *this_00;
  size_t sVar3;
  reference pfVar4;
  reference pfVar5;
  logic_error *plVar6;
  code *pcVar7;
  undefined *puVar8;
  View<float,_false,_std::allocator<unsigned_long>_> v;
  size_t newShape_1 [2];
  View<float,_false,_std::allocator<unsigned_long>_> w;
  View<float,_false,_std::allocator<unsigned_long>_> x;
  size_t shape_1 [3];
  size_t base [3];
  size_t newShape [2];
  size_t shape [3];
  float data [24];
  undefined1 local_1b8 [16];
  size_t *local_1a8;
  size_t local_190;
  ulong local_188;
  CoordinateOrder local_180;
  bool local_17c;
  unsigned_long local_178 [2];
  undefined1 local_168 [16];
  unsigned_long *local_158;
  unsigned_long *local_150;
  unsigned_long *local_148;
  size_t local_140;
  ulong local_138;
  CoordinateOrder local_130;
  bool local_12c;
  View<float,_false,_std::allocator<unsigned_long>_> local_128;
  unsigned_long local_e8 [4];
  unsigned_long local_c8 [4];
  unsigned_long local_a8 [6];
  float local_78 [24];
  
  lVar2 = 0;
  do {
    local_78[lVar2] = (float)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x18);
  local_a8[2] = 2;
  local_a8[3] = 4;
  local_a8[4] = 3;
  local_1b8._0_8_ = local_78;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1b8 + 8),local_a8 + 2,local_a8 + 5,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_168);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8);
  local_168._0_8_ = local_1b8._0_8_;
  if (local_190 == 0) {
    local_158 = (unsigned_long *)0x0;
  }
  else {
    local_158 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                          ((new_allocator<unsigned_long> *)(local_168 + 8),local_190 * 3,(void *)0x0
                          );
  }
  local_150 = local_158 + local_190;
  local_148 = local_150 + local_190;
  local_140 = local_190;
  local_138 = local_188;
  local_130 = local_180;
  local_12c = local_17c;
  memcpy(local_158,local_1a8,local_190 * 0x18);
  andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168);
  local_a8[0] = 4;
  local_a8[1] = 6;
  andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)local_1b8,local_a8,local_a8 + 2);
  if ((float *)local_1b8._0_8_ == (float *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    pcVar7 = std::runtime_error::~runtime_error;
    puVar8 = &std::runtime_error::typeinfo;
  }
  else {
    if (local_190 == 2) {
      if (local_188 != 0x18) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,0);
      if (sVar3 != 4) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar3 = andres::View<float,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,1);
      if (sVar3 != 6) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8);
      if (local_17c == false) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_128.data_._0_4_ = 0;
      pfVar4 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<float,int,false,std::allocator<unsigned_long>>
                         ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,
                          (int *)&local_128);
      local_128.data_ = (pointer)((ulong)local_128.data_._4_4_ << 0x20);
      pfVar5 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<float,int,false,std::allocator<unsigned_long>>
                         ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168,
                          (int *)&local_128);
      if (pfVar4 != pfVar5) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      if (local_188 != 0) {
        sVar3 = 0;
        do {
          pfVar4 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<float,_false,_std::allocator<unsigned_long>_> *)local_1b8,sVar3)
          ;
          fVar1 = *pfVar4;
          pfVar4 = andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<float,_false,_std::allocator<unsigned_long>_> *)local_168,sVar3)
          ;
          if ((fVar1 != *pfVar4) || (NAN(fVar1) || NAN(*pfVar4))) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar3 = sVar3 + 1;
        } while (sVar3 < local_188);
      }
      local_c8[0] = 0;
      local_c8[1] = 1;
      local_c8[2] = 1;
      local_e8[0] = 2;
      local_e8[1] = 3;
      local_e8[2] = 2;
      local_178[0] = 3;
      local_178[1] = 4;
      local_128.data_ = (pointer)0x0;
      local_128.geometry_.shape_ = (size_t *)0x0;
      local_128.geometry_.shapeStrides_ = (size_t *)0x0;
      local_128.geometry_.strides_ = (size_t *)0x0;
      local_128.geometry_.dimension_ = 0;
      local_128.geometry_.size_ = 0;
      local_128.geometry_.coordinateOrder_ = LastMajorOrder;
      local_128.geometry_.isSimple_ = true;
      andres::View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_128);
      andres::View<float,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
                ((View<float,false,std::allocator<unsigned_long>> *)local_1b8,local_c8,local_e8,
                 &local_128);
      andres::View<float,false,std::allocator<unsigned_long>>::reshape<unsigned_long*>
                ((View<float,false,std::allocator<unsigned_long>> *)&local_128,local_178,
                 (unsigned_long *)local_168);
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error((logic_error *)this_00,"test failed.");
    pcVar7 = std::logic_error::~logic_error;
    puVar8 = &std::logic_error::typeinfo;
  }
  __cxa_throw(this_00,puVar8,pcVar7);
}

Assistant:

void ViewTest::reshapeTest()
{
    float data[24];
    for(std::size_t j=0; j<24; ++j) {
        data[j] = static_cast<float>(j);
    }
    std::size_t shape[] = {2, 4, 3};
    andres::View<float, false> v(&shape[0], &shape[3], data);
    andres::View<float, false> w = v; // copy
    
    std::size_t newShape[] = {4, 6};
    v.reshape(&newShape[0], &newShape[2]);

    test(v.dimension() == 2);
    test(v.size() == 24);
    test(v.shape(0) == 4);
    test(v.shape(1) == 6);
    test(v.isSimple());
    test(&v(0) == &w(0));
    for(std::size_t j=0; j<v.size(); ++j) {
        test(v(j) == w(j));
    }

    if(!andres::MARRAY_NO_DEBUG) {
        // negative test
        std::size_t base[] = {0, 1, 1};
        std::size_t shape[] = {2, 3, 2};
        std::size_t newShape[] = {3, 4};
        andres::View<float, false> x = v.view(base, shape);
        try {
            x.reshape(&newShape[0], &newShape[2]);
            test(0 == 1); // reshape should have thrown runtime_error
        }
        catch(std::runtime_error&) {}
    }
}